

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

BBox3fa * __thiscall
embree::SceneGraph::Transformations::bounds
          (BBox3fa *__return_storage_ptr__,Transformations *this,BBox3fa *cbounds)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  size_t sVar20;
  Vector *pVVar21;
  BBox3fa *r;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  
  sVar20 = (this->spaces).size_active;
  aVar26 = _DAT_0024ac30;
  aVar27 = _DAT_0024ac40;
  if (sVar20 != 0) {
    fVar15 = (cbounds->lower).field_0.m128[0];
    fVar16 = (cbounds->lower).field_0.m128[1];
    fVar17 = (cbounds->lower).field_0.m128[2];
    fVar18 = (cbounds->upper).field_0.m128[1];
    fVar1 = (cbounds->upper).field_0.m128[2];
    fVar19 = (cbounds->upper).field_0.m128[0];
    pVVar21 = &((this->spaces).items)->p;
    do {
      fVar28 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.
               field_0.m128[0];
      fVar29 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.
               field_0.m128[1];
      fVar30 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.
               field_0.m128[2];
      fVar31 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.
               field_0.m128[3];
      fVar49 = pVVar21[-2].field_0.m128[0] * fVar16;
      fVar50 = pVVar21[-2].field_0.m128[1] * fVar16;
      fVar51 = pVVar21[-2].field_0.m128[2] * fVar16;
      fVar52 = pVVar21[-2].field_0.m128[3] * fVar16;
      fVar45 = pVVar21[-1].field_0.m128[0] * fVar17 + (pVVar21->field_0).m128[0];
      fVar46 = pVVar21[-1].field_0.m128[1] * fVar17 + (pVVar21->field_0).m128[1];
      fVar47 = pVVar21[-1].field_0.m128[2] * fVar17 + (pVVar21->field_0).m128[2];
      fVar48 = pVVar21[-1].field_0.m128[3] * fVar17 + (pVVar21->field_0).m128[3];
      fVar37 = fVar28 * fVar15;
      fVar38 = fVar29 * fVar15;
      fVar39 = fVar30 * fVar15;
      fVar40 = fVar31 * fVar15;
      fVar55 = fVar49 + fVar45;
      fVar56 = fVar50 + fVar46;
      fVar57 = fVar51 + fVar47;
      fVar58 = fVar52 + fVar48;
      fVar32 = pVVar21[-1].field_0.m128[0] * fVar1 + (pVVar21->field_0).m128[0];
      fVar34 = pVVar21[-1].field_0.m128[1] * fVar1 + (pVVar21->field_0).m128[1];
      fVar35 = pVVar21[-1].field_0.m128[2] * fVar1 + (pVVar21->field_0).m128[2];
      fVar36 = pVVar21[-1].field_0.m128[3] * fVar1 + (pVVar21->field_0).m128[3];
      fVar22 = fVar37 + fVar55;
      fVar23 = fVar38 + fVar56;
      fVar24 = fVar39 + fVar57;
      fVar25 = fVar40 + fVar58;
      fVar49 = fVar49 + fVar32;
      fVar50 = fVar50 + fVar34;
      fVar51 = fVar51 + fVar35;
      fVar52 = fVar52 + fVar36;
      fVar41 = pVVar21[-2].field_0.m128[0] * fVar18;
      fVar42 = pVVar21[-2].field_0.m128[1] * fVar18;
      fVar43 = pVVar21[-2].field_0.m128[2] * fVar18;
      fVar44 = pVVar21[-2].field_0.m128[3] * fVar18;
      auVar33._4_4_ = fVar23;
      auVar33._0_4_ = fVar22;
      auVar33._8_4_ = fVar24;
      auVar33._12_4_ = fVar25;
      auVar53 = minps((undefined1  [16])_DAT_0024ac30,auVar33);
      fVar45 = fVar45 + fVar41;
      fVar46 = fVar46 + fVar42;
      fVar47 = fVar47 + fVar43;
      fVar48 = fVar48 + fVar44;
      fVar41 = fVar41 + fVar32;
      fVar42 = fVar42 + fVar34;
      fVar43 = fVar43 + fVar35;
      fVar44 = fVar44 + fVar36;
      auVar54._4_4_ = fVar23;
      auVar54._0_4_ = fVar22;
      auVar54._8_4_ = fVar24;
      auVar54._12_4_ = fVar25;
      auVar33 = maxps((undefined1  [16])_DAT_0024ac40,auVar54);
      fVar22 = fVar37 + fVar49;
      fVar23 = fVar38 + fVar50;
      fVar24 = fVar39 + fVar51;
      fVar25 = fVar40 + fVar52;
      auVar2._4_4_ = fVar23;
      auVar2._0_4_ = fVar22;
      auVar2._8_4_ = fVar24;
      auVar2._12_4_ = fVar25;
      auVar54 = minps(auVar53,auVar2);
      auVar53._4_4_ = fVar23;
      auVar53._0_4_ = fVar22;
      auVar53._8_4_ = fVar24;
      auVar53._12_4_ = fVar25;
      auVar33 = maxps(auVar33,auVar53);
      fVar22 = fVar37 + fVar45;
      fVar23 = fVar38 + fVar46;
      fVar24 = fVar39 + fVar47;
      fVar25 = fVar40 + fVar48;
      auVar3._4_4_ = fVar23;
      auVar3._0_4_ = fVar22;
      auVar3._8_4_ = fVar24;
      auVar3._12_4_ = fVar25;
      auVar54 = minps(auVar54,auVar3);
      auVar4._4_4_ = fVar23;
      auVar4._0_4_ = fVar22;
      auVar4._8_4_ = fVar24;
      auVar4._12_4_ = fVar25;
      auVar33 = maxps(auVar33,auVar4);
      fVar37 = fVar37 + fVar41;
      fVar38 = fVar38 + fVar42;
      fVar39 = fVar39 + fVar43;
      fVar40 = fVar40 + fVar44;
      auVar7._4_4_ = fVar38;
      auVar7._0_4_ = fVar37;
      auVar7._8_4_ = fVar39;
      auVar7._12_4_ = fVar40;
      auVar54 = minps(auVar54,auVar7);
      auVar8._4_4_ = fVar38;
      auVar8._0_4_ = fVar37;
      auVar8._8_4_ = fVar39;
      auVar8._12_4_ = fVar40;
      auVar33 = maxps(auVar33,auVar8);
      fVar28 = fVar28 * fVar19;
      fVar29 = fVar29 * fVar19;
      fVar30 = fVar30 * fVar19;
      fVar31 = fVar31 * fVar19;
      fVar55 = fVar55 + fVar28;
      fVar56 = fVar56 + fVar29;
      fVar57 = fVar57 + fVar30;
      fVar58 = fVar58 + fVar31;
      auVar13._4_4_ = fVar56;
      auVar13._0_4_ = fVar55;
      auVar13._8_4_ = fVar57;
      auVar13._12_4_ = fVar58;
      auVar54 = minps(auVar54,auVar13);
      auVar14._4_4_ = fVar56;
      auVar14._0_4_ = fVar55;
      auVar14._8_4_ = fVar57;
      auVar14._12_4_ = fVar58;
      auVar33 = maxps(auVar33,auVar14);
      fVar49 = fVar49 + fVar28;
      fVar50 = fVar50 + fVar29;
      fVar51 = fVar51 + fVar30;
      fVar52 = fVar52 + fVar31;
      auVar11._4_4_ = fVar50;
      auVar11._0_4_ = fVar49;
      auVar11._8_4_ = fVar51;
      auVar11._12_4_ = fVar52;
      auVar54 = minps(auVar54,auVar11);
      auVar12._4_4_ = fVar50;
      auVar12._0_4_ = fVar49;
      auVar12._8_4_ = fVar51;
      auVar12._12_4_ = fVar52;
      auVar33 = maxps(auVar33,auVar12);
      fVar45 = fVar45 + fVar28;
      fVar46 = fVar46 + fVar29;
      fVar47 = fVar47 + fVar30;
      fVar48 = fVar48 + fVar31;
      auVar9._4_4_ = fVar46;
      auVar9._0_4_ = fVar45;
      auVar9._8_4_ = fVar47;
      auVar9._12_4_ = fVar48;
      auVar54 = minps(auVar54,auVar9);
      auVar10._4_4_ = fVar46;
      auVar10._0_4_ = fVar45;
      auVar10._8_4_ = fVar47;
      auVar10._12_4_ = fVar48;
      auVar33 = maxps(auVar33,auVar10);
      fVar28 = fVar28 + fVar41;
      fVar29 = fVar29 + fVar42;
      fVar30 = fVar30 + fVar43;
      fVar31 = fVar31 + fVar44;
      auVar5._4_4_ = fVar29;
      auVar5._0_4_ = fVar28;
      auVar5._8_4_ = fVar30;
      auVar5._12_4_ = fVar31;
      auVar54 = minps(auVar54,auVar5);
      aVar26.m128 = (__m128)minps(aVar26.m128,auVar54);
      auVar6._4_4_ = fVar29;
      auVar6._0_4_ = fVar28;
      auVar6._8_4_ = fVar30;
      auVar6._12_4_ = fVar31;
      auVar33 = maxps(auVar33,auVar6);
      aVar27.m128 = (__m128)maxps(aVar27.m128,auVar33);
      pVVar21 = pVVar21 + 4;
      sVar20 = sVar20 - 1;
    } while (sVar20 != 0);
  }
  (__return_storage_ptr__->lower).field_0 = aVar26;
  (__return_storage_ptr__->upper).field_0 = aVar27;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa bounds ( const BBox3fa& cbounds ) const 
      {
        BBox3fa r = empty;
        for (size_t i=0; i<spaces.size(); i++)
          r.extend(xfmBounds(spaces[i],cbounds));
        return r;
      }